

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildMultiplyRectAlpha8
               (uchar *table,uchar *pixels,int x,int y,int w,int h,int stride)

{
  int i;
  int j;
  uchar *data;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  uchar *pixels_local;
  uchar *table_local;
  
  data = pixels + (long)(y * stride) + (long)x;
  for (j = h; 0 < j; j = j + -1) {
    for (i = 0; i < w; i = i + 1) {
      data[i] = table[data[i]];
    }
    data = data + stride;
  }
  return;
}

Assistant:

void    ImFontAtlasBuildMultiplyRectAlpha8(const unsigned char table[256], unsigned char* pixels, int x, int y, int w, int h, int stride)
{
    unsigned char* data = pixels + x + y * stride;
    for (int j = h; j > 0; j--, data += stride)
        for (int i = 0; i < w; i++)
            data[i] = table[data[i]];
}